

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interface.hh
# Opt level: O0

string * __thiscall
kratos::InterfaceDefinition::def_name_abi_cxx11_
          (string *__return_storage_ptr__,InterfaceDefinition *this)

{
  InterfaceDefinition *this_local;
  
  std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)&this->name_);
  return __return_storage_ptr__;
}

Assistant:

[[nodiscard]] std::string def_name() const override { return name_; }